

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O2

void anon_unknown.dwarf_422176e::muldbladd3(limb_t *c0,limb_t *c1,limb_t *c2,limb_t *a,limb_t *b)

{
  ulong uVar1;
  ulong uVar2;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  limb_t lVar3;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *b;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *a;
  uVar8 = SUB168(auVar5 * auVar6,8);
  uVar7 = SUB168(auVar5 * auVar6,0);
  uVar1 = *c0;
  *c0 = *c0 + uVar7;
  uVar2 = *c1;
  lVar3 = *c1;
  *c1 = lVar3 + uVar8 + (ulong)CARRY8(uVar1,uVar7);
  *c2 = *c2 + (ulong)(CARRY8(uVar2,uVar8) || CARRY8(lVar3 + uVar8,(ulong)CARRY8(uVar1,uVar7)));
  uVar1 = *c0;
  *c0 = *c0 + uVar7;
  uVar2 = *c1;
  lVar3 = *c1;
  *c1 = lVar3 + uVar8 + (ulong)CARRY8(uVar1,uVar7);
  *c2 = *c2 + (ulong)(CARRY8(uVar2,uVar8) || CARRY8(lVar3 + uVar8,(ulong)CARRY8(uVar1,uVar7)));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void muldbladd3(limb_t& c0, limb_t& c1, limb_t& c2, const limb_t& a, const limb_t& b)
{
    double_limb_t t = (double_limb_t)a * b;
    limb_t th = t >> LIMB_SIZE;
    limb_t tl = t;

    c0 += tl;
    limb_t tt = th + ((c0 < tl) ? 1 : 0);
    c1 += tt;
    c2 += (c1 < tt) ? 1 : 0;
    c0 += tl;
    th += (c0 < tl) ? 1 : 0;
    c1 += th;
    c2 += (c1 < th) ? 1 : 0;
}